

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSR.cpp
# Opt level: O0

void __thiscall CSR::turntoCSR(CSR *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__s_02;
  ostream *poVar6;
  rep_conflict rVar7;
  int local_9c;
  int local_98;
  int i_5;
  int i_4;
  int i_3;
  double durationSym1;
  rep_conflict local_80;
  rep_conflict local_78;
  int local_70;
  int local_6c;
  int index;
  int r;
  int j;
  int i_2;
  int i_1;
  int i;
  duration<double,_std::ratio<1L,_1L>_> local_50;
  duration<double,_std::ratio<1L,_1L>_> elapsed_seconds;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  end;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  start;
  double *valR;
  int *colIdx;
  int counter;
  int *ptrR;
  int *rowCnt;
  CSR *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->row;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s = operator_new__(uVar5);
  memset(__s,0,uVar5);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(this->row + 1);
  uVar5 = SUB168(auVar2 * ZEXT816(4),0);
  if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s_00 = operator_new__(uVar5);
  memset(__s_00,0,uVar5);
  colIdx._4_4_ = 0;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)this->nonzero;
  uVar5 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s_01 = operator_new__(uVar5);
  memset(__s_01,0,uVar5);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->nonzero;
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  __s_02 = operator_new__(uVar5);
  memset(__s_02,0,uVar5);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point(&end);
  std::chrono::
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  ::time_point((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)&elapsed_seconds);
  _i_1 = std::chrono::_V2::system_clock::now();
  for (i_2 = 0; i_2 < this->nonzero; i_2 = i_2 + 1) {
    *(int *)((long)__s + (long)this->idx[i_2] * 4) =
         *(int *)((long)__s + (long)this->idx[i_2] * 4) + 1;
  }
  for (j = 0; j < this->row; j = j + 1) {
    *(int *)((long)__s_00 + (long)j * 4) = colIdx._4_4_;
    colIdx._4_4_ = *(int *)((long)__s + (long)j * 4) + colIdx._4_4_;
  }
  *(int *)((long)__s_00 + (long)this->row * 4) = this->nonzero;
  end.__d.__r = (duration)(duration)_i_1;
  memset(__s,0,(long)this->row << 2);
  for (r = 0; r < this->col; r = r + 1) {
    for (index = this->ptr[r]; index < this->ptr[r + 1]; index = index + 1) {
      local_6c = this->idx[index];
      local_70 = *(int *)((long)__s + (long)local_6c * 4) +
                 *(int *)((long)__s_00 + (long)local_6c * 4);
      *(int *)((long)__s_01 + (long)local_70 * 4) = r;
      *(double *)((long)__s_02 + (long)local_70 * 8) = this->val[index];
      *(int *)((long)__s + (long)local_6c * 4) = *(int *)((long)__s + (long)local_6c * 4) + 1;
    }
  }
  local_78 = (rep_conflict)std::chrono::_V2::system_clock::now();
  elapsed_seconds.__r = local_78;
  durationSym1 = (double)std::chrono::operator-
                                   ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                     *)&elapsed_seconds,&end);
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,std::ratio<1l,1l>> *)&local_80,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&durationSym1);
  local_50.__r = local_80;
  rVar7 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_50);
  poVar6 = std::operator<<((ostream *)&std::cout,"execution time (turn to CSR2):");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,rVar7);
  std::operator<<(poVar6,"\n");
  for (i_5 = 0; i_5 < this->row + 1; i_5 = i_5 + 1) {
    this->ptr[i_5] = *(int *)((long)__s_00 + (long)i_5 * 4);
  }
  for (local_98 = 0; local_98 < this->nonzero; local_98 = local_98 + 1) {
    this->val[local_98] = *(double *)((long)__s_02 + (long)local_98 * 8);
  }
  for (local_9c = 0; local_9c < this->nonzero; local_9c = local_9c + 1) {
    this->idx[local_9c] = *(int *)((long)__s_01 + (long)local_9c * 4);
  }
  if (__s != (void *)0x0) {
    operator_delete__(__s);
  }
  if (__s_01 != (void *)0x0) {
    operator_delete__(__s_01);
  }
  if (__s_00 != (void *)0x0) {
    operator_delete__(__s_00);
  }
  if (__s_02 != (void *)0x0) {
    operator_delete__(__s_02);
  }
  return;
}

Assistant:

void  CSR::turntoCSR()
{
    int *rowCnt= new int [row]();
    int *ptrR = new int[row+1]();
    int counter = 0;
    int *colIdx = new int[nonzero]();
    double *valR = new double [nonzero]();

    //
  //  int *idxR = new int[nonzero]();
  //
    std::chrono::time_point<std::chrono::system_clock> start, end;
    std::chrono::duration<double> elapsed_seconds;
    start = std::chrono::system_clock::now();
    for(int i=0; i<nonzero; i++)
    {
        rowCnt[idx[i]]++;
    }
    for(int i=0; i<row; i++)
    {
        ptrR[i] = counter;
        counter += rowCnt[i];
    }
    ptrR[row] = nonzero;
    memset(rowCnt, 0, sizeof(int) * row);//makes zero all elements of rowCtn
    for(int i=0; i<col; i++)
    {
        for(int j= ptr[i]; j<ptr[i+1]; j++)
        {
           int r = idx[j];
           int index = rowCnt[r]+ptrR[r];
           colIdx[index] = i;
           valR[index] = val[j];
           rowCnt[r]++;
        }
    }
    end = std::chrono::system_clock::now();
    elapsed_seconds = end - start;
    double durationSym1 = elapsed_seconds.count();
    cout << "execution time (turn to CSR2):" << durationSym1 << "\n";

    for(int i=0; i<row+1; i++)
    {
        ptr[i] = ptrR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        val[i] = valR[i];
    }
    for(int i=0; i<nonzero; i++)
    {
        idx[i] = colIdx[i];
    }

    delete []rowCnt;
    delete []colIdx;
    delete []ptrR;
    delete []valR;
}